

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void get_limit_dual(uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,uint8_t *_blimit1,
                   uint8_t *_limit1,uint8_t *_thresh1,int bd,__m128i *blt_out,__m128i *lt_out,
                   __m128i *thr_out,__m128i *t80_out)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined4 uVar65;
  __m128i alVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  auVar69 = *(undefined1 (*) [16])_blimit0;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar69._0_13_;
  auVar6[0xe] = auVar69[7];
  auVar12[0xc] = auVar69[6];
  auVar12._0_12_ = auVar69._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar69._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar69[5];
  auVar24._0_10_ = auVar69._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar69._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar69[4];
  auVar36._0_8_ = auVar69._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar36._8_7_;
  auVar53._1_8_ = SUB158(auVar47 << 0x40,7);
  auVar53[0] = auVar69[3];
  auVar53._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54[0] = auVar69[2];
  auVar54._11_4_ = 0;
  auVar46._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar46[2] = auVar69[1];
  auVar46[1] = 0;
  auVar46[0] = auVar69[0];
  auVar69 = *(undefined1 (*) [16])_blimit1;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar69._0_13_;
  auVar1[0xe] = auVar69[7];
  auVar7[0xc] = auVar69[6];
  auVar7._0_12_ = auVar69._0_12_;
  auVar7._13_2_ = auVar1._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar69._0_11_;
  auVar13._12_3_ = auVar7._12_3_;
  auVar19[10] = auVar69[5];
  auVar19._0_10_ = auVar69._0_10_;
  auVar19._11_4_ = auVar13._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar69._0_9_;
  auVar25._10_5_ = auVar19._10_5_;
  auVar31[8] = auVar69[4];
  auVar31._0_8_ = auVar69._0_8_;
  auVar31._9_6_ = auVar25._9_6_;
  auVar48._7_8_ = 0;
  auVar48._0_7_ = auVar31._8_7_;
  auVar55._1_8_ = SUB158(auVar48 << 0x40,7);
  auVar55[0] = auVar69[3];
  auVar55._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar56[0] = auVar69[2];
  auVar56._11_4_ = 0;
  auVar37[2] = auVar69[1];
  auVar37._0_2_ = auVar69._0_2_;
  auVar37._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar41._2_13_ = auVar37._2_13_;
  auVar41._0_2_ = auVar69._0_2_ & 0xff;
  auVar69._0_8_ = auVar46._0_8_;
  auVar69._8_8_ = auVar41._0_8_;
  auVar70 = ZEXT416(bd - 8);
  alVar66 = (__m128i)psllw(auVar69,auVar70);
  *blt_out = alVar66;
  auVar69 = *(undefined1 (*) [16])_limit0;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar69._0_13_;
  auVar2[0xe] = auVar69[7];
  auVar8[0xc] = auVar69[6];
  auVar8._0_12_ = auVar69._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar69._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar69[5];
  auVar20._0_10_ = auVar69._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar69._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar69[4];
  auVar32._0_8_ = auVar69._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar32._8_7_;
  auVar57._1_8_ = SUB158(auVar49 << 0x40,7);
  auVar57[0] = auVar69[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar69[2];
  auVar58._11_4_ = 0;
  auVar42._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar42[2] = auVar69[1];
  auVar42[1] = 0;
  auVar42[0] = auVar69[0];
  auVar69 = *(undefined1 (*) [16])_limit1;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar69._0_13_;
  auVar3[0xe] = auVar69[7];
  auVar9[0xc] = auVar69[6];
  auVar9._0_12_ = auVar69._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar69._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar69[5];
  auVar21._0_10_ = auVar69._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar69._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar69[4];
  auVar33._0_8_ = auVar69._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar33._8_7_;
  auVar59._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar59[0] = auVar69[3];
  auVar59._9_6_ = 0;
  auVar60._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar60[0] = auVar69[2];
  auVar60._11_4_ = 0;
  auVar38[2] = auVar69[1];
  auVar38._0_2_ = auVar69._0_2_;
  auVar38._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar69._0_2_ & 0xff;
  auVar67._0_8_ = auVar42._0_8_;
  auVar67._8_8_ = auVar43._0_8_;
  alVar66 = (__m128i)psllw(auVar67,auVar70);
  *lt_out = alVar66;
  auVar69 = *(undefined1 (*) [16])_thresh0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar69._0_13_;
  auVar4[0xe] = auVar69[7];
  auVar10[0xc] = auVar69[6];
  auVar10._0_12_ = auVar69._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar69._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar69[5];
  auVar22._0_10_ = auVar69._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar69._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar69[4];
  auVar34._0_8_ = auVar69._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar34._8_7_;
  auVar61._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar61[0] = auVar69[3];
  auVar61._9_6_ = 0;
  auVar62._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar62[0] = auVar69[2];
  auVar62._11_4_ = 0;
  auVar39[2] = auVar69[1];
  auVar39._0_2_ = auVar69._0_2_;
  auVar39._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar69._0_2_ & 0xff;
  auVar69 = *(undefined1 (*) [16])_thresh1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar69._0_13_;
  auVar5[0xe] = auVar69[7];
  auVar11[0xc] = auVar69[6];
  auVar11._0_12_ = auVar69._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar69._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar69[5];
  auVar23._0_10_ = auVar69._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar69._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar69[4];
  auVar35._0_8_ = auVar69._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar35._8_7_;
  auVar63._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar63[0] = auVar69[3];
  auVar63._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar64[0] = auVar69[2];
  auVar64._11_4_ = 0;
  auVar40[2] = auVar69[1];
  auVar40._0_2_ = auVar69._0_2_;
  auVar40._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar45._2_13_ = auVar40._2_13_;
  auVar45._0_2_ = auVar69._0_2_ & 0xff;
  auVar68._0_8_ = auVar44._0_8_;
  auVar68._8_8_ = auVar45._0_8_;
  alVar66 = (__m128i)psllw(auVar68,auVar70);
  *thr_out = alVar66;
  auVar69 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar69 = pshuflw(auVar69,auVar69,0);
  uVar65 = auVar69._0_4_;
  *(undefined4 *)*t80_out = uVar65;
  *(undefined4 *)((long)*t80_out + 4) = uVar65;
  *(undefined4 *)(*t80_out + 1) = uVar65;
  *(undefined4 *)((long)*t80_out + 0xc) = uVar65;
  return;
}

Assistant:

static inline void get_limit_dual(
    const uint8_t *_blimit0, const uint8_t *_limit0, const uint8_t *_thresh0,
    const uint8_t *_blimit1, const uint8_t *_limit1, const uint8_t *_thresh1,
    int bd, __m128i *blt_out, __m128i *lt_out, __m128i *thr_out,
    __m128i *t80_out) {
  const int shift = bd - 8;
  const __m128i zero = _mm_setzero_si128();

  __m128i x0 =
      _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_blimit0), zero);
  __m128i x1 =
      _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_blimit1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *blt_out = _mm_slli_epi16(x0, shift);

  x0 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_limit0), zero);
  x1 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_limit1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *lt_out = _mm_slli_epi16(x0, shift);

  x0 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_thresh0), zero);
  x1 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_thresh1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *thr_out = _mm_slli_epi16(x0, shift);

  *t80_out = _mm_set1_epi16(1 << (bd - 1));
}